

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O1

Token __thiscall slang::parsing::Lexer::lexStringLiteral(Lexer *this)

{
  byte *pbVar1;
  byte *pbVar2;
  SmallVector<char,_40UL> *this_00;
  LanguageVersion LVar3;
  byte *pbVar4;
  bool bVar5;
  uint uVar6;
  DiagCode DVar7;
  int iVar8;
  Diagnostic *pDVar9;
  undefined4 extraout_var;
  byte bVar10;
  byte bVar11;
  int *computedLen;
  ulong uVar12;
  EVP_PKEY_CTX *in_RDX;
  char *pcVar13;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *extraout_RDX_01;
  EVP_PKEY_CTX *extraout_RDX_02;
  EVP_PKEY_CTX *extraout_RDX_03;
  EVP_PKEY_CTX *extraout_RDX_04;
  EVP_PKEY_CTX *extraout_RDX_05;
  EVP_PKEY_CTX *extraout_RDX_06;
  EVP_PKEY_CTX *extraout_RDX_07;
  EVP_PKEY_CTX *extraout_RDX_08;
  EVP_PKEY_CTX *extraout_RDX_09;
  EVP_PKEY_CTX *extraout_RDX_10;
  char *curr;
  DiagCode code;
  size_t sVar14;
  undefined8 unaff_R13;
  long lVar15;
  Token TVar16;
  string_view arg;
  string_view arg_00;
  char c;
  uint32_t unicodeChar;
  int unicodeLen;
  byte local_55;
  uint local_54;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  ulong local_40;
  int local_34;
  
  pcVar13 = this->sourceBuffer;
  if ((*pcVar13 == '\"') && (pcVar13[1] == '\"')) {
    if ((int)(this->options).languageVersion < 1) {
      pDVar9 = Diagnostics::add(this->diagnostics,(DiagCode)0x20001,
                                (SourceLocation)
                                ((long)(pcVar13 + ~(ulong)this->originalBegin) * 0x10000000 |
                                (ulong)((this->bufferId).id & 0xfffffff)));
      LVar3 = (this->options).languageVersion;
      sVar14 = 9;
      if (LVar3 == Default) {
        pcVar13 = "1800-2017";
      }
      else if (LVar3 == v1800_2023) {
        pcVar13 = "1800-2023";
      }
      else {
        pcVar13 = "";
        sVar14 = 0;
      }
      arg._M_str = pcVar13;
      arg._M_len = sVar14;
      Diagnostic::operator<<(pDVar9,arg);
      in_RDX = extraout_RDX;
    }
    this->sourceBuffer = this->sourceBuffer + 2;
    uVar12 = CONCAT71((int7)((ulong)unaff_R13 >> 8),1);
  }
  else {
    uVar12 = 0;
  }
  this_00 = &this->stringBuffer;
  (this->stringBuffer).super_SmallVectorBase<char>.len = 0;
  local_40 = 0;
  local_54 = (uint)uVar12;
  do {
    pbVar4 = (byte *)this->sourceBuffer;
    lVar15 = (long)pbVar4 - (long)this->originalBegin;
    local_55 = *pbVar4;
    if (local_55 == 0x22) {
      pbVar1 = pbVar4 + 1;
      if ((char)uVar12 == '\0') {
        this->sourceBuffer = (char *)pbVar1;
      }
      else {
        if ((*pbVar1 != 0x22) || (pbVar4[2] != 0x22)) {
          this->sourceBuffer = (char *)pbVar1;
LAB_0041d269:
          SmallVectorBase<char>::emplace_back<char_const&>
                    (&this_00->super_SmallVectorBase<char>,(char *)&local_55);
          bVar5 = true;
          local_40 = 0;
          in_RDX = extraout_RDX_01;
          goto LAB_0041d436;
        }
        this->sourceBuffer = (char *)(pbVar4 + 3);
      }
LAB_0041d2fa:
      bVar5 = false;
    }
    else if (local_55 == 0x5c) {
      pbVar1 = pbVar4 + 1;
      this->sourceBuffer = (char *)pbVar1;
      local_55 = pbVar4[1];
      in_RDX = (EVP_PKEY_CTX *)CONCAT71((int7)((ulong)in_RDX >> 8),local_55);
      pbVar2 = pbVar4 + 2;
      this->sourceBuffer = (char *)pbVar2;
      bVar5 = true;
      uVar6 = (uint)local_55;
      if (local_55 < 0x5c) {
        if (local_55 < 0x30) {
          if (uVar6 != 10) {
            if (uVar6 == 0xd) {
              uVar12 = (ulong)local_54;
              if (*pbVar2 == 10) {
                this->sourceBuffer = (char *)(pbVar4 + 3);
              }
              goto LAB_0041d436;
            }
            if (uVar6 == 0x22) {
              local_50._M_len = CONCAT71(local_50._M_len._1_7_,0x22);
              goto LAB_0041d424;
            }
            goto LAB_0041d466;
          }
        }
        else {
          if (uVar6 - 0x30 < 8) {
            uVar6 = (uint)(byte)(local_55 - 0x30);
            local_55 = *pbVar2;
            if ((local_55 & 0xf8) == 0x30) {
              this->sourceBuffer = (char *)(pbVar4 + 3);
              uVar6 = (uint)(byte)(local_55 - 0x30) + uVar6 * 8;
              local_55 = pbVar4[3];
              if ((local_55 & 0xf8) != 0x30) goto LAB_0041d287;
              this->sourceBuffer = (char *)(pbVar4 + 4);
              uVar12 = (ulong)local_54;
              if (0x1f < uVar6) {
                Diagnostics::add(this->diagnostics,(DiagCode)0xd0002,
                                 (SourceLocation)
                                 (lVar15 * 0x10000000 | (ulong)((this->bufferId).id & 0xfffffff)));
                in_RDX = extraout_RDX_00;
                goto LAB_0041d436;
              }
              bVar10 = (local_55 - 0x30) + (char)uVar6 * '\b';
            }
            else {
LAB_0041d287:
              bVar10 = (byte)uVar6;
            }
LAB_0041d290:
            local_50._M_len = CONCAT71(local_50._M_len._1_7_,bVar10);
            uVar12 = (ulong)local_54;
            SmallVectorBase<char>::emplace_back<char>
                      (&this_00->super_SmallVectorBase<char>,(char *)&local_50);
            in_RDX = extraout_RDX_02;
            goto LAB_0041d436;
          }
LAB_0041d466:
          this->sourceBuffer = (char *)pbVar1;
          computedLen = &local_34;
          bVar5 = scanUTF8Char(this,(bool)((byte)local_40 & 1),(uint32_t *)&local_50,computedLen);
          uVar12 = CONCAT71((int7)((ulong)computedLen >> 8),1);
          in_RDX = extraout_RDX_08;
          if (bVar5) {
            bVar5 = isPrintableUnicode((uint32_t)local_50._M_len);
            in_RDX = extraout_RDX_09;
            if (bVar5) {
              DVar7.subsystem = Lexer;
              DVar7.code = 0x15;
              code.subsystem = Lexer;
              code.code = 0x18;
              if (local_55 == 0x25) {
                code = DVar7;
              }
              pDVar9 = Diagnostics::add(this->diagnostics,code,
                                        (SourceLocation)
                                        (lVar15 * 0x10000000 |
                                        (ulong)((this->bufferId).id & 0xfffffff)));
              arg_00._M_len = (size_t)local_34;
              arg_00._M_str = (char *)pbVar1;
              Diagnostic::operator<<(pDVar9,arg_00);
              in_RDX = extraout_RDX_10;
            }
            uVar12 = local_40 & 0xffffffff;
          }
          this->sourceBuffer = (char *)pbVar1;
          local_40 = uVar12 & 0xffffffff;
        }
      }
      else {
        if (local_55 < 0x6e) {
          if (uVar6 == 0x5c) {
            local_50._M_len = CONCAT71(local_50._M_len._1_7_,0x5c);
          }
          else if (uVar6 == 0x61) {
            local_50._M_len = CONCAT71(local_50._M_len._1_7_,7);
          }
          else {
            if (uVar6 != 0x66) goto LAB_0041d466;
            local_50._M_len = CONCAT71(local_50._M_len._1_7_,0xc);
          }
        }
        else if (uVar6 == 0x75 || local_55 < 0x75) {
          if (uVar6 == 0x6e) {
            local_50._M_len = CONCAT71(local_50._M_len._1_7_,10);
          }
          else {
            if (uVar6 != 0x74) goto LAB_0041d466;
            local_50._M_len = CONCAT71(local_50._M_len._1_7_,9);
          }
        }
        else if (uVar6 == 0x76) {
          local_50._M_len = CONCAT71(local_50._M_len._1_7_,0xb);
        }
        else {
          if (uVar6 != 0x78) goto LAB_0041d466;
          local_55 = *pbVar2;
          bVar10 = local_55 - 0x30;
          if ((bVar10 < 10) ||
             ((local_55 - 0x41 < 0x26 &&
              ((0x3f0000003fU >> ((ulong)(local_55 - 0x41) & 0x3f) & 1) != 0)))) {
            this->sourceBuffer = (char *)(pbVar4 + 3);
            if ('9' < (char)local_55) {
              if ((char)local_55 < 'G') {
                bVar10 = local_55 - 0x37;
              }
              else {
                bVar10 = local_55 + 0xa9;
              }
            }
            local_55 = pbVar4[3];
            bVar11 = local_55 - 0x30;
            if ((bVar11 < 10) ||
               ((local_55 - 0x41 < 0x26 &&
                ((0x3f0000003fU >> ((ulong)(local_55 - 0x41) & 0x3f) & 1) != 0)))) {
              this->sourceBuffer = (char *)(pbVar4 + 4);
              if ('9' < (char)local_55) {
                if ((char)local_55 < 'G') {
                  bVar11 = local_55 - 0x37;
                }
                else {
                  bVar11 = local_55 + 0xa9;
                }
              }
              bVar10 = bVar10 * '\x10' + bVar11;
            }
            goto LAB_0041d290;
          }
          Diagnostics::add(this->diagnostics,(DiagCode)0x90002,
                           (SourceLocation)
                           (lVar15 * 0x10000000 | (ulong)((this->bufferId).id & 0xfffffff)));
          local_50._M_len = CONCAT71(local_50._M_len._1_7_,0x78);
        }
LAB_0041d424:
        SmallVectorBase<char>::emplace_back<char>
                  (&this_00->super_SmallVectorBase<char>,(char *)&local_50);
        in_RDX = extraout_RDX_07;
      }
      bVar5 = true;
      uVar12 = (ulong)local_54;
    }
    else {
      if ((local_55 == 10 || local_55 == 0xd) && (char)uVar12 == '\0') {
LAB_0041d2da:
        Diagnostics::add(this->diagnostics,(DiagCode)0x70002,
                         (SourceLocation)
                         (lVar15 * 0x10000000 | (ulong)((this->bufferId).id & 0xfffffff)));
        in_RDX = extraout_RDX_04;
        goto LAB_0041d2fa;
      }
      if (local_55 == 0) {
        if (this->sourceEnd + -1 <= pbVar4) goto LAB_0041d2da;
        this->errorCount = this->errorCount + 1;
        Diagnostics::add(this->diagnostics,(DiagCode)0x50002,
                         (SourceLocation)
                         (lVar15 * 0x10000000 | (ulong)((this->bufferId).id & 0xfffffff)));
        this->sourceBuffer = this->sourceBuffer + 1;
        in_RDX = extraout_RDX_03;
      }
      else {
        if (-1 < (char)local_55) {
          this->sourceBuffer = (char *)(pbVar4 + 1);
          goto LAB_0041d269;
        }
        bVar5 = scanUTF8Char(this,(bool)((byte)local_40 & 1),(uint32_t *)&local_50,&local_34);
        in_RDX = extraout_RDX_05;
        if (0 < local_34) {
          lVar15 = 0;
          do {
            SmallVectorBase<char>::emplace_back<char_const&>
                      (&this_00->super_SmallVectorBase<char>,(char *)(pbVar4 + lVar15));
            lVar15 = lVar15 + 1;
            in_RDX = extraout_RDX_06;
          } while (lVar15 < local_34);
        }
        local_40 = CONCAT71((int7)(local_40 >> 8),(byte)local_40 | !bVar5);
      }
      bVar5 = true;
    }
LAB_0041d436:
    if (!bVar5) {
      iVar8 = SmallVectorBase<char>::copy
                        (&this_00->super_SmallVectorBase<char>,(EVP_PKEY_CTX *)this->alloc,in_RDX);
      local_50._M_str = (char *)CONCAT44(extraout_var,iVar8);
      TVar16 = create<std::basic_string_view<char,std::char_traits<char>>>
                         (this,StringLiteral,&local_50);
      return TVar16;
    }
  } while( true );
}

Assistant:

Token Lexer::lexStringLiteral() {
    bool tripleQuoted = false;
    if (peek() == '"' && peek(1) == '"') {
        // New in v1800-2023: triple quoted string literals
        if (options.languageVersion < LanguageVersion::v1800_2023) {
            addDiag(diag::WrongLanguageVersion, currentOffset() - 1)
                << toString(options.languageVersion);
        }
        tripleQuoted = true;
        advance(2);
    }

    stringBuffer.clear();
    bool sawUTF8Error = false;
    while (true) {
        size_t offset = currentOffset();
        char c = peek();

        if (c == '\\') {
            advance();
            c = peek();
            advance();

            uint32_t charCode;
            switch (c) {
                    // clang-format off
                case 'n': stringBuffer.push_back('\n'); break;
                case 't': stringBuffer.push_back('\t'); break;
                case '\\': stringBuffer.push_back('\\'); break;
                case '"': stringBuffer.push_back('"'); break;
                case 'v': stringBuffer.push_back('\v'); break;
                case 'f': stringBuffer.push_back('\f'); break;
                case 'a': stringBuffer.push_back('\a'); break;
                case '\n': break;
                case '\r': consume('\n'); break;
                case '0': case '1': case '2': case '3':
                case '4': case '5': case '6': case '7':
                    // clang-format on
                    // octal character code
                    charCode = getDigitValue(c);
                    if (isOctalDigit(c = peek())) {
                        advance();
                        charCode = (charCode * 8) + getDigitValue(c);
                        if (isOctalDigit(c = peek())) {
                            advance();
                            charCode = (charCode * 8) + getDigitValue(c);
                            if (charCode > 255) {
                                addDiag(diag::OctalEscapeCodeTooBig, offset);
                                break;
                            }
                        }
                    }
                    stringBuffer.push_back((char)charCode);
                    break;
                case 'x':
                    c = peek();
                    if (!isHexDigit(c)) {
                        addDiag(diag::InvalidHexEscapeCode, offset);
                        stringBuffer.push_back('x');
                    }
                    else {
                        advance();
                        charCode = getHexDigitValue(c);
                        if (isHexDigit(c = peek())) {
                            advance();
                            charCode = (charCode * 16) + getHexDigitValue(c);
                        }
                        stringBuffer.push_back((char)charCode);
                    }
                    break;
                default: {
                    auto curr = --sourceBuffer;

                    uint32_t unicodeChar;
                    int unicodeLen;
                    if (scanUTF8Char(sawUTF8Error, &unicodeChar, unicodeLen)) {
                        if (isPrintableUnicode(unicodeChar)) {
                            // '\%' is not an actual escape code but other tools silently allow it
                            // and major UVM headers use it, so we'll issue a (fairly quiet) warning
                            // about it. Otherwise issue a louder warning (on by default).
                            DiagCode code = c == '%' ? diag::NonstandardEscapeCode
                                                     : diag::UnknownEscapeCode;
                            addDiag(code, offset) << std::string_view(curr, (size_t)unicodeLen);
                        }
                    }
                    else {
                        sawUTF8Error = true;
                    }

                    // Back up so that we handle this character as a normal char in the outer loop,
                    // regardless of whether it's valid or not.
                    sourceBuffer = curr;
                    break;
                }
            }
        }
        else if (c == '"') {
            if (tripleQuoted) {
                if (peek(1) == '"' && peek(2) == '"') {
                    advance(3);
                    break;
                }
                else {
                    advance();
                    stringBuffer.push_back(c);
                    sawUTF8Error = false;
                }
            }
            else {
                advance();
                break;
            }
        }
        else if (isNewline(c) && !tripleQuoted) {
            addDiag(diag::ExpectedClosingQuote, offset);
            break;
        }
        else if (c == '\0') {
            if (reallyAtEnd()) {
                addDiag(diag::ExpectedClosingQuote, offset);
                break;
            }

            // otherwise just error and ignore
            errorCount++;
            addDiag(diag::EmbeddedNull, offset);
            advance();
        }
        else if (isASCII(c)) {
            advance();
            stringBuffer.push_back(c);
            sawUTF8Error = false;
        }
        else {
            auto curr = sourceBuffer;

            uint32_t unused;
            int unicodeLen;
            sawUTF8Error |= !scanUTF8Char(sawUTF8Error, &unused, unicodeLen);

            // Regardless of whether the character sequence was valid or not
            // we want to add the bytes to the string, to allow for cases where
            // the source is actually something like latin-1 encoded. Ignoring the
            // warning and carrying on will do the right thing for them.
            for (int i = 0; i < unicodeLen; i++)
                stringBuffer.push_back(curr[i]);
        }
    }

    return create(TokenKind::StringLiteral, toStringView(stringBuffer.copy(alloc)));
}